

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.h
# Opt level: O0

ON_3dmPageSettings * __thiscall
ON_3dmPageSettings::operator=(ON_3dmPageSettings *this,ON_3dmPageSettings *param_1)

{
  ON_3dmPageSettings *param_1_local;
  ON_3dmPageSettings *this_local;
  
  memcpy(this,param_1,0x38);
  ON_wString::operator=(&this->m_printer_name,&param_1->m_printer_name);
  return this;
}

Assistant:

class ON_CLASS ON_3dmPageSettings
{
public:
  ON_3dmPageSettings();
  ~ON_3dmPageSettings();

  bool IsValid( ON_TextLog* text_log = 0 ) const;

  void Default();

  int m_page_number;

  // Overall size of the page in millimeters
  double m_width_mm;
  double m_height_mm;

  // Page margins in millimeters
  double m_left_margin_mm;
  double m_right_margin_mm;
  double m_top_margin_mm;
  double m_bottom_margin_mm;

  ON_wString m_printer_name;

  bool Write(ON_BinaryArchive& archive) const;
  bool Read(ON_BinaryArchive& archive);
}